

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageOptions::MergePartialFromCodedStream
          (MessageOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  void *pvVar2;
  uint8 *puVar3;
  uint uVar4;
  bool bVar5;
  byte bVar6;
  int byte_limit;
  uint32 uVar7;
  Type *this_01;
  pair<int,_int> pVar8;
  byte *pbVar9;
  bool *pbVar10;
  UnknownFieldSet *pUVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  pair<unsigned_long,_bool> pVar15;
  
  this_00 = &this->_internal_metadata_;
LAB_001fd564:
  pbVar9 = input->buffer_;
  uVar7 = 0;
  if (pbVar9 < input->buffer_end_) {
    bVar6 = *pbVar9;
    uVar7 = (uint32)bVar6;
    pbVar1 = pbVar9 + 1;
    uVar13 = (uint)bVar6;
    if ((char)bVar6 < '\x01') {
      if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar13) < 0x80)) goto LAB_001fd7f6;
      uVar13 = ((uint)bVar6 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar9 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar14 = (ulong)uVar13 | 0x100000000;
  }
  else {
LAB_001fd7f6:
    uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar14 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar14 = 0x100000000;
    }
    uVar14 = uVar7 | uVar14;
  }
  uVar13 = (uint)uVar14;
  if ((uVar14 & 0x100000000) == 0) goto switchD_001fd633_caseD_4;
  uVar4 = (uint)(uVar14 >> 3) & 0x1fffffff;
  cVar12 = (char)uVar14;
  switch(uVar4) {
  case 1:
    if (cVar12 == '\b') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar9 = input->buffer_;
      pbVar10 = &this->message_set_wire_format_;
      if ((pbVar9 < input->buffer_end_) && (bVar6 = *pbVar9, -1 < (char)bVar6)) goto LAB_001fd774;
      pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar15.first;
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
LAB_001fd77d:
      *pbVar10 = uVar14 != 0;
      goto LAB_001fd564;
    }
    break;
  case 2:
    if (cVar12 == '\x10') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar9 = input->buffer_;
      pbVar10 = &this->no_standard_descriptor_accessor_;
      if ((input->buffer_end_ <= pbVar9) || (bVar6 = *pbVar9, (char)bVar6 < '\0')) {
        pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar14 = pVar15.first;
joined_r0x001fd747:
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        goto LAB_001fd77d;
      }
LAB_001fd774:
      uVar14 = (ulong)bVar6;
      input->buffer_ = pbVar9 + 1;
      goto LAB_001fd77d;
    }
    break;
  case 3:
    if (cVar12 == '\x18') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      pbVar9 = input->buffer_;
      pbVar10 = &this->deprecated_;
      if ((input->buffer_end_ <= pbVar9) || (bVar6 = *pbVar9, (char)bVar6 < '\0')) {
        pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar14 = pVar15.first;
        goto joined_r0x001fd747;
      }
      goto LAB_001fd774;
    }
    break;
  case 4:
  case 5:
  case 6:
    break;
  case 7:
    if (cVar12 == '8') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar9 = input->buffer_;
      pbVar10 = &this->map_entry_;
      if ((input->buffer_end_ <= pbVar9) || (bVar6 = *pbVar9, (char)bVar6 < '\0')) {
        pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar14 = pVar15.first;
        goto joined_r0x001fd747;
      }
      goto LAB_001fd774;
    }
    break;
  default:
    if ((uVar4 != 999) || (cVar12 != ':')) break;
    this_01 = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
    if ((long)pVar8 < 0) {
      return false;
    }
    bVar5 = UninterpretedOption::MergePartialFromCodedStream(this_01,input);
    if (!bVar5) {
      return false;
    }
    bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first);
    if (!bVar5) {
      return false;
    }
    goto LAB_001fd564;
  }
switchD_001fd633_caseD_4:
  if (uVar13 == 0) {
    return true;
  }
  if ((uVar13 & 7) == 4) {
    return true;
  }
  pvVar2 = (this_00->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (uVar13 < 8000) {
    if (((ulong)pvVar2 & 1) == 0) {
      pUVar11 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar11 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    bVar5 = internal::WireFormat::SkipField(input,uVar13,pUVar11);
  }
  else {
    if (((ulong)pvVar2 & 1) == 0) {
      pUVar11 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar11 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    bVar5 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,uVar13,input,
                       (Message *)&_MessageOptions_default_instance_,pUVar11);
  }
  if (bVar5 == false) {
    return false;
  }
  goto LAB_001fd564;
}

Assistant:

bool MessageOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.MessageOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_message_set_wire_format();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &message_set_wire_format_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_no_standard_descriptor_accessor();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &no_standard_descriptor_accessor_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool map_entry = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_map_entry();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &map_entry_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.MessageOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.MessageOptions)
  return false;
#undef DO_
}